

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O0

void __thiscall
cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::make_item_matchcase
          (Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits> *this)

{
  bool bVar1;
  pointer pCVar2;
  reference pcVar3;
  long in_RDI;
  iterator item_last;
  iterator item_it;
  const_iterator props_it;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  Char_conflict in_stack_ffffffffffffffd7;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_18;
  __normal_iterator<const_cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties_*,_std::vector<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>_>
  local_10 [2];
  
  if ((*(byte *)(in_RDI + 0xb8) & 1) == 0) {
    local_10[0]._M_current =
         (CharProperties *)
         std::
         vector<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>
         ::cbegin((vector<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>
                   *)in_stack_ffffffffffffffc8);
    local_18._M_current =
         (char *)std::vector<char,_std::allocator<char>_>::begin(in_stack_ffffffffffffffc8);
    std::vector<char,_std::allocator<char>_>::end(in_stack_ffffffffffffffc8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                               *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                              (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                               *)in_stack_ffffffffffffffc8), bVar1) {
      pCVar2 = __gnu_cxx::
               __normal_iterator<const_cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties_*,_std::vector<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>_>
               ::operator->(local_10);
      if ((pCVar2->uppercase & 1U) != 0) {
        pcVar3 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                 operator*(&local_18);
        in_stack_ffffffffffffffd7 = SimpleStringTraits::uppercase_to_lowercase(*pcVar3);
        pcVar3 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                 operator*(&local_18);
        *pcVar3 = in_stack_ffffffffffffffd7;
      }
      __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
                (&local_18);
      __gnu_cxx::
      __normal_iterator<const_cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties_*,_std::vector<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>_>
      ::operator++(local_10);
    }
  }
  return;
}

Assistant:

void make_item_matchcase() {
    if (!case_sensitive_) {
      auto props_it = props_.cbegin();
      for (auto item_it = item_.begin(), item_last = item_.end();
           item_it != item_last; ++item_it, ++props_it) {
        if (props_it->uppercase) {
          *item_it = StringTraits::uppercase_to_lowercase(*item_it);
        }
      }
    }
  }